

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_ncasecmp(char *s1,char *s2,size_t len)

{
  int iVar1;
  __int32_t **pp_Var2;
  long lVar3;
  bool bVar4;
  
  if (len == 0) {
    return 0;
  }
  pp_Var2 = __ctype_tolower_loc();
  lVar3 = 0;
  while( true ) {
    iVar1 = (*pp_Var2)[(byte)s1[lVar3]] - (*pp_Var2)[(byte)s2[lVar3]];
    if (iVar1 != 0) {
      return iVar1;
    }
    if (s1[lVar3] == 0) break;
    bVar4 = len - 1 == lVar3;
    lVar3 = lVar3 + 1;
    if (bVar4) {
      return 0;
    }
  }
  return 0;
}

Assistant:

int mg_ncasecmp(const char *s1, const char *s2, size_t len) {
    int diff = 0;

    if (len > 0)
        do {
            diff = lowercase(s1++) - lowercase(s2++);
        } while (diff == 0 && s1[-1] != '\0' && --len > 0);

    return diff;
}